

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O3

err_t belsRecover2(octet *s,size_t count,size_t len,octet *si)

{
  size_t m;
  word *c;
  word *stack;
  size_t sVar1;
  u64 *dest;
  u64 *dest_00;
  word *da;
  word *db;
  long lVar2;
  long lVar3;
  bool_t bVar4;
  int iVar5;
  octet *poVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  u64 *dest_01;
  word *d;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  size_t n;
  octet *poVar18;
  ulong uVar19;
  size_t n_00;
  size_t sVar20;
  err_t eVar21;
  long lVar22;
  word *local_90;
  long local_40;
  
  eVar21 = 0x6d;
  if ((0xffffffffffffffef < count - 0x11) && (len == 0x20 || (len & 0xfffffffffffffff7) == 0x10)) {
    uVar17 = len | 1;
    bVar4 = memIsValid(si,uVar17 * count);
    if ((bVar4 != 0) && (bVar4 = memIsValid(s,len), bVar4 != 0)) {
      poVar6 = si + uVar17;
      uVar14 = 0;
      do {
        lVar16 = uVar14 * uVar17;
        if ((byte)(si[lVar16] - 0x11) < 0xf0) {
          return 0x1f9;
        }
        uVar14 = uVar14 + 1;
        poVar18 = poVar6;
        for (uVar19 = uVar14; uVar19 < count; uVar19 = uVar19 + 1) {
          if (si[lVar16] == *poVar18) {
            return 0x1f9;
          }
          poVar18 = poVar18 + uVar17;
        }
        poVar6 = poVar6 + uVar17;
      } while (uVar14 != count);
      uVar14 = len >> 3;
      sVar7 = ppMul_deep(uVar14,uVar14);
      n_00 = uVar14 * count;
      m = uVar14 + 1;
      sVar8 = ppMod_deep(n_00,m);
      sVar7 = utilMax(2,sVar7,sVar8);
      if (1 < count) {
        lVar16 = count - 1;
        sVar1 = uVar14 * 2;
        sVar8 = uVar14 * 2 + 1;
        sVar20 = uVar14 * 3;
        n = sVar1;
        uVar19 = uVar14;
        do {
          sVar9 = ppExGCD_deep(m,uVar19 + 1);
          sVar10 = ppMul_deep(uVar19,uVar19);
          sVar11 = ppMul_deep(n,uVar14);
          sVar12 = ppMul_deep(len >> 2,uVar19);
          sVar13 = ppMod_deep(sVar20,sVar8);
          sVar7 = utilMax(6,sVar7,sVar9,sVar10,sVar11,sVar12,sVar13);
          sVar8 = sVar8 + uVar14;
          uVar19 = uVar19 + uVar14;
          sVar20 = sVar20 + sVar1;
          n = n + sVar1;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      local_40 = count - 1;
      lVar22 = uVar14 * local_40;
      lVar16 = (count * 2 + -1) * uVar14;
      uVar15 = (count * 2 + -2) * uVar14;
      uVar19 = (count + 1) * uVar14;
      if (uVar19 <= uVar15 && uVar15 - uVar19 != 0) {
        uVar19 = uVar15;
      }
      dest_01 = (u64 *)blobCreate(sVar7 + lVar22 * 0x10 + (uVar14 + n_00 + m + lVar16 + uVar19) * 8
                                  + 0x20);
      if (dest_01 == (u64 *)0x0) {
        eVar21 = 0x6e;
      }
      else {
        dest = (u64 *)((long)dest_01 + len + 8);
        lVar2 = n_00 * 8 + len + 8;
        lVar3 = lVar22 * 8 + lVar2 + 8;
        dest_00 = (u64 *)((long)dest_01 + len + lVar22 * 8 + lVar3 + 0x18);
        u64From(dest_00,si + 1,len);
        belsStdM((octet *)dest,len,(ulong)*si);
        u64From(dest,dest,len);
        c = dest_00 + lVar16;
        stack = c + uVar19;
        *(undefined8 *)((long)dest_01 + len * 2 + 8) = 1;
        *(undefined8 *)((long)dest_01 + len) = 1;
        if (1 < count) {
          d = (word *)((long)dest_01 + n_00 * 8 + len + 0x10);
          da = (word *)((long)dest_01 + lVar22 * 8 + lVar2 + 0x10);
          db = (word *)((long)dest_01 + lVar22 * 8 + lVar3 + 0x10);
          lVar16 = uVar14 * 2;
          local_90 = (word *)((long)dest_01 + (count * 0x28 + -0x10) * uVar14 + len * 2 + 0x28);
          poVar6 = si + len + 2;
          sVar7 = 0;
          sVar8 = 0;
          do {
            belsStdM((octet *)dest_01,len,(ulong)poVar6[-1]);
            u64From(dest_01,dest_01,len);
            sVar20 = uVar14 + sVar8 + 1;
            ppExGCD(d,da,db,dest_01,m,dest,sVar20,stack);
            iVar5 = wwCmpW(d,sVar20,1);
            if (iVar5 != 0) {
              eVar21 = 0x1f9;
              goto LAB_00118c50;
            }
            sVar20 = uVar14 + sVar8;
            ppMul(c,da,sVar20,dest_00,sVar20,stack);
            sVar1 = lVar16 + sVar7;
            ppMul(dest_00,c,sVar1,dest_01,uVar14,stack);
            wwXor2((word *)((long)dest_00 + len),c,sVar1);
            u64From(c,poVar6,len);
            ppMul(d,db,uVar14,c,uVar14,stack);
            ppMul(c,d,len >> 2,dest,sVar20,stack);
            wwXor2(local_90,d,len >> 2);
            wwXor2(dest_00,c,uVar14 * 3 + sVar8);
            ppMul(c,dest_01,uVar14,dest,sVar20,stack);
            wwXor2((word *)((long)c + len),dest,sVar20);
            wwXor2(local_90,dest_01,uVar14);
            wwCopy(dest,c,lVar16 + sVar8);
            *(undefined8 *)((long)dest_01 + sVar8 * 8 + uVar14 * 0x10 + len + 8) = 1;
            ppMod(dest_00,dest_00,sVar7 + uVar14 * 3,dest,lVar16 + sVar8 + 1,stack);
            local_90 = local_90 + uVar14;
            poVar6 = poVar6 + uVar17;
            local_40 = local_40 + -1;
            sVar7 = sVar1;
            sVar8 = sVar20;
          } while (local_40 != 0);
        }
        eVar21 = 0;
        belsStdM((octet *)dest_01,len,0);
        u64From(dest_01,dest_01,len);
        *(undefined8 *)((long)dest_01 + len) = 1;
        ppMod(dest_00,dest_00,n_00,dest_01,m,stack);
        u64To(s,len,dest_00);
LAB_00118c50:
        blobClose(dest_01);
      }
    }
  }
  return eVar21;
}

Assistant:

err_t belsRecover2(octet s[], size_t count, size_t len, const octet si[])
{
	size_t n, i, j, deep;
	void* state;
	word* f;
	word* g;
	word* d;
	word* u;
	word* v;
	word* c;
	word* t;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || count == 0 || count > 16 ||
		!memIsValid(si, count * (len + 1)) || !memIsValid(s, len))
		return ERR_BAD_INPUT;
	// проверить номера частичных секретов
	for (i = 0; i < count; ++i)
	{
		if (si[i * (len + 1)] == 0 || si[i * (len + 1)] > 16)
			return ERR_BAD_PUBKEY;
		for (j = i + 1; j < count; ++j)
			if (si[i * (len + 1)] == si[j * (len + 1)])
				return ERR_BAD_PUBKEY;
	}
	// расчет глубины стека
	n = W_OF_O(len);
	deep = utilMax(2,
		ppMul_deep(n, n),
		ppMod_deep(count * n, n + 1));
	for (i = 1; i < count; ++i)
		deep = utilMax(6,
			deep,
			ppExGCD_deep(n + 1, i * n + 1),
			ppMul_deep(i * n, i * n),
			ppMul_deep(2 * i * n, n),
			ppMul_deep(2 * n, i * n),
			ppMod_deep((2 * i + 1) * n, (i + 1) * n + 1));
	deep += O_OF_W(
		n + 1 +
		count * n + 1 +
		(count - 1) * n + 1 +
		(count - 1) * n + 1 +
		n + 1 +
		(2 * count - 1) * n +
		MAX2((2 * count - 2) * n, (count + 1) * n));
	// создать состояние
	state = blobCreate(deep);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	g = f + n + 1;
	d = g + count * n + 1;
	u = d + (count - 1) * n + 1;
	v = u + (count - 1) * n + 1;
	c = v + n + 1;
	t = c + (2 * count - 1) * n;
	stack = t + MAX2((2 * count - 2) * n, (count + 1) * n);
	// [n]c(x) <- s1(x)
	wwFrom(c, si + 1, len);
	// [n + 1]g(x) <- x^l + m1(x)
	belsStdM((octet*)g, len, si[0]);
	wwFrom(g, g, len), g[n] = 1;
	// цикл по пользователям
	for (f[n] = 1, i = 1; i < count; ++i)
	{
		// [n + 1]f(x) <- x^l + mi(x)
		belsStdM((octet*)f, len, si[i * (len + 1)]);
		wwFrom(f, f, len);
		// найти d(x) = \gcd(f(x), g(x)) и коэфф. Безу [i * n]u(x), [n]v(x)
		ppExGCD(d, u, v, f, n + 1, g, i * n + 1, stack);
		ASSERT(u[i * n] == 0 && v[n] == 0);
		// d(x) != 1? 
		if (wwCmpW(d, i * n + 1, 1) != 0)
		{
			blobClose(state);
			return ERR_BAD_PUBKEY;
		}
		// [2 * i * n]c(x) <- u(x)f(x)c(x)
		// (с помощью [2 * i * n]t)
		ppMul(t, u, i * n, c, i * n, stack);
		ppMul(c, t, 2 * i * n, f, n, stack);
		wwXor2(c + n, t, 2 * i * n);
		// c(x) <- c(x) + v(x)g(x)si(x)
		// (с помощью [2 * n]d и [(i + 2) * n]t)
		wwFrom(t, si + i * (len + 1) + 1, len);
		ppMul(d, v, n, t, n, stack);
		ppMul(t, d, 2 * n, g, i * n, stack);
		wwXor2(t + i * n, d, 2 * n);
		wwXor2(c, t, (i + 2) * n);
		// [(i + 1) * n + 1]g(x) <- g(x)f(x)
		// (с помощью [(i + 1) * n]t)
		ppMul(t, f, n, g, i * n, stack);
		wwXor2(t + n, g, i * n);
		wwXor2(t + i * n, f, n);
		wwCopy(g, t, (i + 1) * n);
		g[(i + 1) * n] = 1;
		// [(i + 1) * n]c(x) <- c(x) mod g(x)
		ppMod(c, c, (2 * i + 1) * n, g, (i + 1) * n + 1, stack);
		ASSERT(c[(i + 1) * n] == 0);
	}
	// [n]s(x) <- c(x) mod (x^l + m0(x))
	belsStdM((octet*)f, len, 0);
	wwFrom(f, f, len), f[n] = 1;
	ppMod(c, c, count * n, f, n + 1, stack);
	ASSERT(c[n] == 0);
	wwTo(s, len, c);
	// завершение
	blobClose(state);
	return ERR_OK;
}